

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ssize_t sVar1;
  size_t __nbytes;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  ifstream *ifs;
  IForReader iForReader;
  IIfAllReader iIfAllReader;
  IBlockReader iBlockReader;
  IWhileReader iWhileReader;
  ISentenceReader iSentenceReader;
  ofstream my_ofs;
  ifstream my_ifs;
  
  std::ifstream::ifstream(&my_ifs,"I:\\IDE\\CLion\\ICDecoder\\input.txt",_S_in);
  std::ofstream::ofstream(&my_ofs,"I:\\IDE\\CLion\\ICDecoder\\output.txt",_S_out);
  IIfAllReader::IIfAllReader(&iIfAllReader,&my_ifs,(ostream *)&my_ofs,0);
  IWhileReader::IWhileReader(&iWhileReader,&my_ifs,(ostream *)&my_ofs,0);
  IForReader::IForReader(&iForReader,&my_ifs,(ostream *)&my_ofs,0);
  IBlockReader::IBlockReader(&iBlockReader,&my_ifs,(ostream *)&my_ofs,0);
  ifs = &my_ifs;
  __nbytes = 0;
  ISentenceReader::ISentenceReader(&iSentenceReader,ifs,(ostream *)&my_ofs,0,';');
  __buf = extraout_RDX;
  do {
    do {
      do {
        do {
          do {
            sVar1 = IAbstractReader::read(&iForReader.super_IAbstractReader,(int)ifs,__buf,__nbytes)
            ;
            __buf = __buf_00;
          } while ((char)sVar1 != '\0');
          sVar1 = IAbstractReader::read((IAbstractReader *)&iWhileReader,(int)ifs,__buf_00,__nbytes)
          ;
          __buf = __buf_01;
        } while ((char)sVar1 != '\0');
        sVar1 = IAbstractReader::read
                          (&iIfAllReader.super_IAbstractReader,(int)ifs,__buf_01,__nbytes);
        __buf = __buf_02;
      } while ((char)sVar1 != '\0');
      sVar1 = IAbstractReader::read(&iBlockReader.super_IAbstractReader,(int)ifs,__buf_02,__nbytes);
      __buf = __buf_03;
    } while ((char)sVar1 != '\0');
    sVar1 = IAbstractReader::read(&iSentenceReader.super_IAbstractReader,(int)ifs,__buf_03,__nbytes)
    ;
    __buf = extraout_RDX_00;
  } while ((char)sVar1 != '\0');
  std::ifstream::close();
  std::ofstream::close();
  ISentenceReader::~ISentenceReader(&iSentenceReader);
  IAbstractReader::~IAbstractReader(&iBlockReader.super_IAbstractReader);
  IAbstractReader::~IAbstractReader(&iForReader.super_IAbstractReader);
  IBoolReader::~IBoolReader(&iWhileReader.super_IBoolReader);
  IAbstractReader::~IAbstractReader(&iIfAllReader.super_IAbstractReader);
  std::ofstream::~ofstream(&my_ofs);
  std::ifstream::~ifstream(&my_ifs);
  return 0;
}

Assistant:

int main() {
    std::ifstream my_ifs(R"(I:\IDE\CLion\ICDecoder\input.txt)",std::ios_base::in);
    std::ofstream my_ofs(R"(I:\IDE\CLion\ICDecoder\output.txt)",std::ios_base::out);
    IIfAllReader iIfAllReader(&my_ifs, &my_ofs, 0);
    IWhileReader iWhileReader(&my_ifs, &my_ofs, 0);
    IForReader iForReader(&my_ifs, &my_ofs, 0);
    IBlockReader iBlockReader(&my_ifs, &my_ofs, 0);
    ISentenceReader iSentenceReader(&my_ifs, &my_ofs, 0);

    while(true)
    {
        if(iForReader.read());
        else if(iWhileReader.read());
        else if(iIfAllReader.read());
        else if(iBlockReader.read());
        else if(iSentenceReader.read());
        else break;
    }

    my_ifs.close();
    my_ofs.close();
    return 0;
}